

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void secp256k1_ellswift_prng(uchar *out32,secp256k1_sha256 *hasher,uint32_t cnt)

{
  long lVar1;
  secp256k1_sha256 *psVar2;
  uchar buf4 [4];
  secp256k1_sha256 hash;
  
  psVar2 = &hash;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)psVar2->s = *(undefined8 *)hasher->s;
    hasher = (secp256k1_sha256 *)(hasher->s + 2);
    psVar2 = (secp256k1_sha256 *)(psVar2->s + 2);
  }
  buf4 = (uchar  [4])cnt;
  secp256k1_sha256_write(&hash,buf4,4);
  secp256k1_sha256_finalize(&hash,out32);
  return;
}

Assistant:

static void secp256k1_ellswift_prng(unsigned char* out32, const secp256k1_sha256 *hasher, uint32_t cnt) {
    secp256k1_sha256 hash = *hasher;
    unsigned char buf4[4];
#ifdef VERIFY
    size_t blocks = hash.bytes >> 6;
#endif
    buf4[0] = cnt;
    buf4[1] = cnt >> 8;
    buf4[2] = cnt >> 16;
    buf4[3] = cnt >> 24;
    secp256k1_sha256_write(&hash, buf4, 4);
    secp256k1_sha256_finalize(&hash, out32);
#ifdef VERIFY
    /* Writing and finalizing together should trigger exactly one SHA256 compression. */
    VERIFY_CHECK(((hash.bytes) >> 6) == (blocks + 1));
#endif
}